

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iio.c
# Opt level: O0

int main(void)

{
  uint local_20;
  float local_1c;
  int iio_int;
  float iio_float;
  mraa_iio_context iio;
  mraa_result_t status;
  
  iio._4_4_ = 0;
  iio._0_4_ = 0;
  mraa_init();
  _iio_int = mraa_iio_init(0);
  if (_iio_int == 0) {
    fprintf(_stderr,"Failed to initialize IIO device\n");
    mraa_deinit();
  }
  else {
    iio._0_4_ = mraa_iio_write_float(0x3c9cfbb9,_iio_int,"in_accel_scale");
    if ((int)iio == 0) {
      iio._0_4_ = mraa_iio_read_float(_iio_int,"in_accel_scale",&local_1c);
      if ((int)iio == 0) {
        fprintf(_stdout,"IIO scale: %f\n",(double)local_1c);
        iio._0_4_ = mraa_iio_write_int(_iio_int,"scan_elements/in_accel_x_en",1);
        if ((int)iio == 0) {
          iio._0_4_ = mraa_iio_read_int(_iio_int,"scan_elements/in_accel_x_en",&local_20);
          if ((int)iio == 0) {
            fprintf(_stdout,"IIO enable status: %d\n",(ulong)local_20);
            iio._0_4_ = mraa_iio_trigger_buffer(_iio_int,interrupt,_iio_int);
            if ((int)iio == 0) {
              fprintf(_stdout,"Waiting for the trigger...\n");
              sleep(100);
              mraa_iio_close(_iio_int);
              mraa_deinit();
              return 0;
            }
            fprintf(_stderr,"Failed to set IIO buffer trigger\n");
          }
          else {
            fprintf(_stderr,"Failed to read enable status from IIO device\n");
          }
        }
        else {
          fprintf(_stderr,"Failed to enable axis of the IIO device\n");
        }
      }
      else {
        fprintf(_stderr,"Failed to read scale from IIO device\n");
      }
    }
    else {
      fprintf(_stderr,"Failed to write scale to IIO device\n");
    }
    mraa_result_print((int)iio);
    mraa_iio_close(_iio_int);
    mraa_deinit();
  }
  return 1;
}

Assistant:

int
main(void)
{
    mraa_result_t status = MRAA_SUCCESS;
    mraa_iio_context iio;
    float iio_float;
    int iio_int;

    /* initialize mraa for the platform (not needed most of the times) */
    mraa_init();

    //! [Interesting]
    /* initialize iio */
    iio = mraa_iio_init(IIO_DEV);
    if (iio == NULL) {
        fprintf(stderr, "Failed to initialize IIO device\n");
        mraa_deinit();
        return EXIT_FAILURE;
    }

    status = mraa_iio_write_float(iio, "in_accel_scale", 0.019163);
    if (status != MRAA_SUCCESS) {
        fprintf(stderr, "Failed to write scale to IIO device\n");
        goto err_exit;
    }

    status = mraa_iio_read_float(iio, "in_accel_scale", &iio_float);
    if (status != MRAA_SUCCESS) {
        fprintf(stderr, "Failed to read scale from IIO device\n");
        goto err_exit;
    }

    fprintf(stdout, "IIO scale: %f\n", iio_float);

    status = mraa_iio_write_int(iio, "scan_elements/in_accel_x_en", 1);
    if (status != MRAA_SUCCESS) {
        fprintf(stderr, "Failed to enable axis of the IIO device\n");
        goto err_exit;
    }

    status = mraa_iio_read_int(iio, "scan_elements/in_accel_x_en", &iio_int);
    if (status != MRAA_SUCCESS) {
        fprintf(stderr, "Failed to read enable status from IIO device\n");
        goto err_exit;
    }

    fprintf(stdout, "IIO enable status: %d\n", iio_int);

    status = mraa_iio_trigger_buffer(iio, interrupt, (void*) iio);
    if (status != MRAA_SUCCESS) {
        fprintf(stderr, "Failed to set IIO buffer trigger\n");
        goto err_exit;
    }

    /* wait for the trigger */
    fprintf(stdout, "Waiting for the trigger...\n");
    sleep(100);

    /* close IIO device */
    mraa_iio_close(iio);

    //! [Interesting]
    /* deinitialize mraa for the platform (not needed most of the times) */
    mraa_deinit();

    return EXIT_SUCCESS;

err_exit:
    mraa_result_print(status);

    /* close IIO device */
    mraa_iio_close(iio);

    /* deinitialize mraa for the platform (not needed most of the times) */
    mraa_deinit();

    return EXIT_FAILURE;
}